

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFontAtlas::GetTexDataAsRGBA32
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  int *piVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  uchar *in_RAX;
  uint *puVar4;
  int iVar5;
  long lVar6;
  uchar *pixels;
  uchar *local_38;
  
  puVar4 = this->TexPixelsRGBA32;
  if (puVar4 == (uint *)0x0) {
    lVar6 = 0;
    local_38 = in_RAX;
    GetTexDataAsAlpha8(this,&local_38,(int *)0x0,(int *)0x0,(int *)0x0);
    pIVar3 = GImGui;
    iVar5 = this->TexWidth;
    iVar2 = this->TexHeight;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    puVar4 = (uint *)(*(pIVar3->IO).MemAllocFn)((long)(iVar5 * iVar2 * 4));
    this->TexPixelsRGBA32 = puVar4;
    for (iVar5 = this->TexHeight * this->TexWidth; 0 < iVar5; iVar5 = iVar5 + -1) {
      puVar4[lVar6] = (uint)local_38[lVar6] << 0x18 | 0xffffff;
      lVar6 = lVar6 + 1;
    }
  }
  *out_pixels = (uchar *)puVar4;
  if (out_width != (int *)0x0) {
    *out_width = this->TexWidth;
  }
  if (out_height != (int *)0x0) {
    *out_height = this->TexHeight;
  }
  if (out_bytes_per_pixel != (int *)0x0) {
    *out_bytes_per_pixel = 4;
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsRGBA32(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Convert to RGBA32 format on demand
    // Although it is likely to be the most commonly used format, our font rendering is 1 channel / 8 bpp
    if (!TexPixelsRGBA32)
    {
        unsigned char* pixels;
        GetTexDataAsAlpha8(&pixels, NULL, NULL);
        TexPixelsRGBA32 = (unsigned int*)ImGui::MemAlloc((size_t)(TexWidth * TexHeight * 4));
        const unsigned char* src = pixels;
        unsigned int* dst = TexPixelsRGBA32;
        for (int n = TexWidth * TexHeight; n > 0; n--)
            *dst++ = ((unsigned int)(*src++) << 24) | 0x00FFFFFF;
    }

    *out_pixels = (unsigned char*)TexPixelsRGBA32;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 4;
}